

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_stores(void)

{
  _Bool _Var1;
  object *local_28;
  object *obj;
  store *store;
  town *town;
  wchar_t i;
  
  wr_u16b(z_info->store_max);
  for (town._4_4_ = 0; town._4_4_ < world->num_towns; town._4_4_ = town._4_4_ + 1) {
    for (obj = (object *)world->towns[town._4_4_].stores; obj != (object *)0x0;
        obj = (object *)obj->kind) {
      _Var1 = store_is_home((store *)obj);
      if (_Var1) {
        wr_byte(0xff);
      }
      else {
        wr_byte((uint8_t)*(undefined4 *)&obj->artifact->name);
      }
      wr_byte((uint8_t)obj->oidx);
      for (local_28 = *(object **)&(obj->grid).y; local_28 != (object *)0x0;
          local_28 = local_28->next) {
        wr_item(local_28->known);
        wr_item(local_28);
      }
    }
  }
  return;
}

Assistant:

void wr_stores(void)
{
	int i;

	wr_u16b(z_info->store_max);
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *store = town->stores;
		while (store) {
			struct object *obj;

			/* Save the current owner */
			if (store_is_home(store))
				wr_byte(-1);
			else
				wr_byte(store->owner->oidx);

			/* Save the stock size */
			wr_byte(store->stock_num);

			/* Save the stock */
			for (obj = store->stock; obj; obj = obj->next) {
				wr_item(obj->known);
				wr_item(obj);
			}
			store = store->next;
		}
	}
}